

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_sign.c
# Opt level: O0

int gost_ec_compute_public(EC_KEY *ec)

{
  int iVar1;
  EC_GROUP *ctx_00;
  BN_CTX *ctx_01;
  BIGNUM *n;
  EC_KEY *in_RDI;
  int ok;
  BN_CTX *ctx;
  BIGNUM *priv_key;
  EC_POINT *pub_key;
  EC_GROUP *group;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  EC_POINT *r;
  EC_GROUP *group_00;
  undefined4 local_4;
  
  if (in_RDI == (EC_KEY *)0x0) {
    ctx_00 = (EC_GROUP *)0x0;
  }
  else {
    ctx_00 = EC_KEY_get0_group(in_RDI);
  }
  r = (EC_POINT *)0x0;
  local_4 = 0;
  if (ctx_00 == (EC_GROUP *)0x0) {
    ERR_GOST_error(0,0,in_stack_ffffffffffffffb8,0);
    local_4 = 0;
  }
  else {
    group_00 = ctx_00;
    ctx_01 = (BN_CTX *)BN_CTX_secure_new();
    if (ctx_01 == (BN_CTX *)0x0) {
      ERR_GOST_error((int)((ulong)ctx_00 >> 0x20),(int)ctx_00,in_stack_ffffffffffffffb8,0);
      local_4 = 0;
    }
    else {
      BN_CTX_start(ctx_01);
      n = EC_KEY_get0_private_key(in_RDI);
      if (n == (BIGNUM *)0x0) {
        ERR_GOST_error((int)((ulong)ctx_00 >> 0x20),(int)ctx_00,in_stack_ffffffffffffffb8,0);
      }
      else {
        r = EC_POINT_new(group_00);
        if (r == (EC_POINT *)0x0) {
          ERR_GOST_error((int)((ulong)ctx_00 >> 0x20),(int)ctx_00,in_stack_ffffffffffffffb8,0);
        }
        else {
          iVar1 = gost_ec_point_mul((EC_GROUP *)group_00,(EC_POINT *)r,(BIGNUM *)n,
                                    (EC_POINT *)ctx_01,
                                    (BIGNUM *)CONCAT44(local_4,in_stack_ffffffffffffffc8),
                                    (BN_CTX *)ctx_00);
          if (iVar1 == 0) {
            ERR_GOST_error((int)((ulong)ctx_00 >> 0x20),(int)ctx_00,in_stack_ffffffffffffffb8,0);
          }
          else {
            iVar1 = EC_KEY_set_public_key(in_RDI,r);
            if (iVar1 == 0) {
              ERR_GOST_error((int)((ulong)ctx_00 >> 0x20),(int)ctx_00,in_stack_ffffffffffffffb8,0);
            }
            else {
              local_4 = 1;
            }
          }
        }
      }
      if (r != (EC_POINT *)0x0) {
        EC_POINT_free(r);
      }
      BN_CTX_end(ctx_01);
      BN_CTX_free(ctx_01);
    }
  }
  return local_4;
}

Assistant:

int gost_ec_compute_public(EC_KEY *ec)
{
    const EC_GROUP *group = (ec) ? EC_KEY_get0_group(ec) : NULL;
    EC_POINT *pub_key = NULL;
    const BIGNUM *priv_key = NULL;
    BN_CTX *ctx = NULL;
    int ok = 0;

    if (!group) {
        GOSTerr(GOST_F_GOST_EC_COMPUTE_PUBLIC, GOST_R_KEY_IS_NOT_INITIALIZED);
        return 0;
    }

    ctx = BN_CTX_secure_new();
    if (!ctx) {
        GOSTerr(GOST_F_GOST_EC_COMPUTE_PUBLIC, ERR_R_MALLOC_FAILURE);
        return 0;
    }

    BN_CTX_start(ctx);
    priv_key = EC_KEY_get0_private_key(ec);
    if (!priv_key) {
        GOSTerr(GOST_F_GOST_EC_COMPUTE_PUBLIC, ERR_R_EC_LIB);
        goto err;
    }

    pub_key = EC_POINT_new(group);
    if (!pub_key) {
        GOSTerr(GOST_F_GOST_EC_COMPUTE_PUBLIC, ERR_R_MALLOC_FAILURE);
        goto err;
    }

    if (!gost_ec_point_mul(group, pub_key, priv_key, NULL, NULL, ctx)) {
        GOSTerr(GOST_F_GOST_EC_COMPUTE_PUBLIC, ERR_R_EC_LIB);
        goto err;
    }
    if (!EC_KEY_set_public_key(ec, pub_key)) {
        GOSTerr(GOST_F_GOST_EC_COMPUTE_PUBLIC, ERR_R_EC_LIB);
        goto err;
    }
    ok = 1;
 err:
    if (pub_key)
        EC_POINT_free(pub_key);
    BN_CTX_end(ctx);
    BN_CTX_free(ctx);
    return ok;
}